

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O0

GLint __thiscall
VertexAttrib64Bit::LimitTest::calculateAttributeLocation
          (LimitTest *this,attributeConfiguration *configuration,GLint attribute,GLint n_type)

{
  GLint n_columns_1;
  GLint n_rows_1;
  GLint n_elements_1;
  GLint n_columns;
  GLint n_rows;
  GLint n_elements;
  GLint i;
  GLint result;
  GLint n_types;
  GLint n_type_local;
  GLint attribute_local;
  attributeConfiguration *configuration_local;
  LimitTest *this_local;
  
  n_rows = configuration->m_n_types;
  n_elements = 0;
  while (n_rows = n_rows + -1, n_type < n_rows) {
    n_elements = (configuration->m_n_elements[n_rows] / configuration->m_n_rows[n_rows]) *
                 configuration->m_n_attributes_per_group + n_elements;
  }
  if (attribute != -1) {
    n_elements = (configuration->m_n_elements[n_type] / configuration->m_n_rows[n_type]) *
                 ((configuration->m_n_attributes_per_group + -1) - attribute) + n_elements;
  }
  return n_elements;
}

Assistant:

GLint LimitTest::calculateAttributeLocation(const attributeConfiguration& configuration, GLint attribute,
											GLint n_type) const
{
	const GLint n_types = configuration.m_n_types;
	GLint		result  = 0;

	/* Amount of location required for types after given "n_type" */
	for (GLint i = n_types - 1; i > n_type; --i)
	{
		const GLint n_elements = configuration.m_n_elements[i];
		const GLint n_rows	 = configuration.m_n_rows[i];
		const GLint n_columns  = n_elements / n_rows;

		result += n_columns * configuration.m_n_attributes_per_group;
	}

	/* Amount of locations required for attributes after given attribute in given "n_type" */
	/* Arrayed attributes does not have any attributes after */
	if (m_array_attribute != attribute)
	{
		const GLint n_elements = configuration.m_n_elements[n_type];
		const GLint n_rows	 = configuration.m_n_rows[n_type];
		const GLint n_columns  = n_elements / n_rows;

		result += n_columns * (configuration.m_n_attributes_per_group - 1 - attribute);
	}

	/* Done */
	return result;
}